

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  lVar1 = *(long *)(*(long *)&(this->
                              super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix
                   + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x19de558;
  *(undefined8 *)this_00 = 0x19de620;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->
                super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh + lVar1)
  ;
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->
                super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019ddbc8,(TPZStructMatrix *)this);
  *(undefined8 *)(this_00 + 1) = 0x19de038;
  *(undefined8 *)this_00 = 0x19ddf58;
  TPZStructMatrixTBBFlow<std::complex<double>_>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019ddbf0,
             (TPZStructMatrixTBBFlow<std::complex<double>_> *)
             &(this->
              super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
              ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0);
  *(undefined8 *)(this_00 + 1) = 0x19ddb40;
  *(undefined8 *)this_00 = 0x19dd978;
  *(undefined8 *)&this_00->field_0xa0 = 0x19dda48;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBSpStructMatrix<TVar,TPar>::Clone(){
    return new TPZBSpStructMatrix(*this);
}